

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.cpp
# Opt level: O1

string * __thiscall
(anonymous_namespace)::ErrorErrorCategory::message_abi_cxx11_
          (string *__return_storage_ptr__,void *this,int condition)

{
  char *pcVar1;
  char *pcVar2;
  
  if (condition == 2) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = 
    "Inconvertible error value. An error has occurred that could not be converted to a known std::error_code. Please file a bug."
    ;
    pcVar1 = "";
  }
  else {
    if (condition != 1) {
      llvm::llvm_unreachable_internal
                ("Unhandled error code",
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/Error.cpp"
                 ,0x29);
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "Multiple errors";
    pcVar1 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string message(int condition) const override {
      switch (static_cast<ErrorErrorCode>(condition)) {
      case ErrorErrorCode::MultipleErrors:
        return "Multiple errors";
      case ErrorErrorCode::InconvertibleError:
        return "Inconvertible error value. An error has occurred that could "
               "not be converted to a known std::error_code. Please file a "
               "bug.";
      }
      llvm_unreachable("Unhandled error code");
    }